

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinux.c
# Opt level: O0

void pm_init(void)

{
  pm_linuxalsa_init();
  pm_initialized = 1;
  pm_default_input_device_id =
       find_default_device("/PortMidi/PM_RECOMMENDED_INPUT_DEVICE",1,pm_default_input_device_id);
  pm_default_output_device_id =
       find_default_device("/PortMidi/PM_RECOMMENDED_OUTPUT_DEVICE",0,pm_default_output_device_id);
  return;
}

Assistant:

void pm_init()
{
    /* Note: it is not an error for PMALSA to fail to initialize. 
     * It may be a design error that the client cannot query what subsystems
     * are working properly other than by looking at the list of available
     * devices.
     */
    #ifdef PMALSA
	pm_linuxalsa_init();
    #endif
    #ifdef PMNULL
        pm_linuxnull_init();
    #endif
    // this is set when we return to Pm_Initialize, but we need it
    // now in order to (successfully) call Pm_CountDevices()
    pm_initialized = TRUE;      
    pm_default_input_device_id = find_default_device(
        "/PortMidi/PM_RECOMMENDED_INPUT_DEVICE", TRUE,
        pm_default_input_device_id);
    pm_default_output_device_id = find_default_device(
        "/PortMidi/PM_RECOMMENDED_OUTPUT_DEVICE", FALSE,
        pm_default_output_device_id);
}